

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

void __thiscall
Json::Value::CZString::CZString(CZString *this,char *cstr,DuplicationPolicy allocate)

{
  size_t sVar1;
  char *__dest;
  runtime_error *this_00;
  uint uVar2;
  
  __dest = cstr;
  if (allocate == duplicate) {
    sVar1 = strlen(cstr);
    uVar2 = 0x7ffffffe;
    if ((uint)sVar1 < 0x7ffffffe) {
      uVar2 = (uint)sVar1;
    }
    __dest = (char *)malloc((ulong)(uVar2 + 1));
    if (__dest == (char *)0x0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Failed to allocate string value buffer");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    memcpy(__dest,cstr,(ulong)uVar2);
    __dest[uVar2] = '\0';
  }
  this->cstr_ = __dest;
  this->index_ = allocate;
  return;
}

Assistant:

Value::CZString::CZString( const char *cstr, DuplicationPolicy allocate )
   : cstr_( allocate == duplicate ? duplicateStringValue(cstr) 
                                  : cstr )
   , index_( allocate )
{
}